

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::Internal::
     Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)0>
     ::evaluate(quad_value_bit_vector *lhs,quad_value_bit_vector *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  
  uVar3 = lhs->N;
  if (rhs->N == uVar3) {
    if ((int)uVar3 < 1) {
      bVar4 = true;
    }
    else {
      lVar5 = 0;
      do {
        uVar1 = (lhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5].value;
        if (uVar1 == '\x03') {
          __assert_fail("!a.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        uVar2 = (rhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar5].value;
        if (uVar2 == '\x03') {
          __assert_fail("!b.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x10a,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        bVar4 = uVar1 == uVar2 && uVar1 != '\x02';
      } while ((uVar1 == uVar2 && uVar1 != '\x02') &&
              (bVar6 = (ulong)uVar3 - 1 != lVar5, lVar5 = lVar5 + 1, bVar6));
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }